

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

UniValue * RPCLockedMemoryInfo(void)

{
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  Stats stats;
  UniValue *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  LockedPool *in_stack_fffffffffffffc28;
  UniValue *this;
  UniValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  allocator<char> local_379;
  undefined8 local_378;
  allocator<char> local_369;
  undefined8 local_368;
  allocator<char> local_359;
  undefined8 local_358;
  allocator<char> local_349;
  undefined8 local_348;
  allocator<char> local_339;
  undefined8 local_338;
  allocator<char> local_329;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  LockedPoolManager::Instance();
  LockedPool::stats(in_stack_fffffffffffffc28);
  this_00 = (UniValue *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string(in_stack_fffffffffffffc20);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffc28,
                     (VType)((ulong)in_stack_fffffffffffffc20 >> 0x20),in_stack_fffffffffffffc18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  local_338 = local_328;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  local_348 = local_320;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  local_358 = local_318;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  local_368 = local_310;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  local_378 = local_308;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc58,(char *)this_00,(allocator<char> *)this);
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)in_RDI);
  UniValue::pushKV(this_00,(string *)this,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffc08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_379);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static UniValue RPCLockedMemoryInfo()
{
    LockedPool::Stats stats = LockedPoolManager::Instance().stats();
    UniValue obj(UniValue::VOBJ);
    obj.pushKV("used", uint64_t(stats.used));
    obj.pushKV("free", uint64_t(stats.free));
    obj.pushKV("total", uint64_t(stats.total));
    obj.pushKV("locked", uint64_t(stats.locked));
    obj.pushKV("chunks_used", uint64_t(stats.chunks_used));
    obj.pushKV("chunks_free", uint64_t(stats.chunks_free));
    return obj;
}